

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O2

bool __thiscall adios2sys::Directory::FileIsSymlink(Directory *this,size_t i)

{
  bool bVar1;
  string sStack_28;
  
  GetFilePath_abi_cxx11_(&sStack_28,this,i);
  bVar1 = SystemTools::FileIsSymlink(&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return bVar1;
}

Assistant:

bool Directory::FileIsSymlink(std::size_t i) const
{
  std::string const& path = this->GetFilePath(i);
#if defined(_WIN32) && !defined(__CYGWIN__)
  auto const& data = this->Internal->Files[i].FindData;
  return kwsys::SystemTools::FileIsSymlinkWithAttr(
    Encoding::ToWindowsExtendedPath(path), data.dwFileAttributes);
#else
  return kwsys::SystemTools::FileIsSymlink(path);
#endif
}